

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::javanano::FileJavaPackage_abi_cxx11_
          (string *__return_storage_ptr__,javanano *this,Params *params,FileDescriptor *file)

{
  char *pcVar1;
  FileDescriptor *this_00;
  bool bVar2;
  string *psVar3;
  ulong uVar4;
  allocator local_22;
  undefined1 local_21;
  Params *local_20;
  FileDescriptor *file_local;
  Params *params_local;
  string *result;
  
  local_20 = params;
  file_local = (FileDescriptor *)this;
  params_local = (Params *)__return_storage_ptr__;
  psVar3 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)params);
  bVar2 = Params::has_java_package((Params *)this,psVar3);
  this_00 = file_local;
  pcVar1 = (anonymous_namespace)::kDefaultPackage;
  if (bVar2) {
    psVar3 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)local_20);
    psVar3 = Params::java_package((Params *)this_00,psVar3);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
  }
  else {
    local_21 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_22);
    std::allocator<char>::~allocator((allocator<char> *)&local_22);
    FileDescriptor::package_abi_cxx11_((FileDescriptor *)local_20);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'.');
      }
      psVar3 = FileDescriptor::package_abi_cxx11_((FileDescriptor *)local_20);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar3);
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".");
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"nano");
  }
  return __return_storage_ptr__;
}

Assistant:

string FileJavaPackage(const Params& params, const FileDescriptor* file) {
  if (params.has_java_package(file->name())) {
    return params.java_package(file->name());
  } else {
    string result = kDefaultPackage;
    if (!file->package().empty()) {
      if (!result.empty()) result += '.';
      result += file->package();
    }

    if (!result.empty()) {
      result += ".";
    }
    result += "nano";

    return result;
  }
}